

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMQ.cpp
# Opt level: O3

void __thiscall liblogger::LogMQ::Log(LogMQ *this,LogType Type,string *str)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  LogException *pLVar5;
  char *buf;
  stringstream ss;
  char *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  local_1d0 = (char *)0x0;
  iVar1 = asprintf(&local_1d0,"%d:%s",Type);
  if (local_1d0 == (char *)0x0) {
    pLVar5 = (LogException *)__cxa_allocate_exception(0x28);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LogMQ::Log Malloc Failed","");
    LogException::LogException(pLVar5,(string *)local_1a8);
    __cxa_throw(pLVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = mq_send(this->m_id,local_1d0,(long)iVar1,0);
  if (-1 < iVar1) {
    free(local_1d0);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"LogMQ::Log failed to write to queue: ",0x25);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1a8 + 0x10),(this->m_QName)._M_dataplus._M_p,
                      (this->m_QName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' error: ",9);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  free(local_1d0);
  pLVar5 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar5,&local_1c8);
  __cxa_throw(pLVar5,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogMQ::Log(const LogType Type, const std::string &str) {
	char *buf = 0;
	int len = asprintf(&buf, "%d:%s", Type, str.c_str());
	if (!buf) {
		throw(LogException("LogMQ::Log Malloc Failed"));
	}

	if (mq_send(m_id, buf, len, 0) < 0) {
		std::stringstream ss;
		ss << "LogMQ::Log failed to write to queue: " << m_QName << "' error: " << strerror(errno);
		free(buf);
		throw(LogException(ss.str()));
	}

	free(buf);
}